

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O2

void stable_sqrt_sort_common_sort(int **arr,int Len,int **extbuf,int *Tags)

{
  int **ppiVar1;
  uint uVar2;
  int *piVar3;
  int i;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int **ppiVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  int iVar24;
  int **ppiVar25;
  int iVar26;
  int iVar27;
  ulong uVar28;
  int *piVar29;
  uint uVar30;
  int **arr_00;
  int iVar31;
  uint uVar32;
  int *c;
  int iVar33;
  int iVar34;
  int **ppiVar35;
  long lVar36;
  ulong uVar37;
  bool bVar38;
  int **local_f8;
  int **local_d8;
  
  if (Len < 0x10) {
    for (uVar4 = 1; uVar11 = uVar4, (int)uVar4 < Len; uVar4 = uVar4 + 1) {
      while (0 < (int)uVar11) {
        uVar10 = uVar11 - 1;
        piVar29 = arr[uVar10];
        if (*piVar29 <= *arr[uVar11]) break;
        arr[uVar10] = arr[uVar11];
        arr[uVar11] = piVar29;
        uVar11 = uVar10;
      }
    }
  }
  else {
    uVar4 = 1;
    do {
      uVar11 = uVar4;
      uVar37 = (ulong)uVar11;
      uVar4 = uVar11 * 2;
    } while ((int)(uVar11 * uVar11) < Len);
    memcpy(extbuf,arr,uVar37 * 8);
    stable_sqrt_sort_common_sort(extbuf,uVar11,arr,Tags);
    ppiVar1 = arr + uVar37;
    uVar4 = Len - uVar11;
    lVar7 = (long)(int)uVar4;
    ppiVar13 = ppiVar1;
    for (lVar8 = 1; lVar8 < lVar7; lVar8 = lVar8 + 2) {
      iVar31 = **ppiVar13;
      iVar16 = *ppiVar13[1];
      ppiVar13[-2] = ppiVar13[iVar16 < iVar31];
      ppiVar13[-1] = ppiVar13[1 - (ulong)(iVar16 < iVar31)];
      ppiVar13 = ppiVar13 + 2;
    }
    if ((uVar4 & 1) != 0) {
      ppiVar1[lVar7 + -3] = ppiVar1[lVar7 + -1];
    }
    ppiVar13 = ppiVar1 + -2;
    uVar9 = 2;
    while (iVar16 = (int)uVar9, iVar16 < (int)uVar11) {
      uVar10 = iVar16 * 2;
      iVar31 = -iVar16;
      lVar8 = 0;
      ppiVar25 = ppiVar13;
      uVar15 = uVar4;
      for (lVar36 = 0; lVar36 <= (int)(uVar4 + iVar16 * -2); lVar36 = lVar36 + (int)uVar10) {
        stable_sqrt_sort_merge_left_with_x_buf(ppiVar25,iVar16,iVar16,iVar31);
        lVar8 = lVar8 + (uVar9 << 0x21);
        uVar15 = uVar15 + iVar16 * -2;
        ppiVar25 = ppiVar25 + (int)uVar10;
      }
      if (iVar16 < (int)uVar15) {
        stable_sqrt_sort_merge_left_with_x_buf
                  ((int **)((lVar8 >> 0x1d) + (long)ppiVar13),iVar16,uVar15 + iVar31,iVar31);
      }
      else {
        for (; lVar36 < lVar7; lVar36 = lVar36 + 1) {
          ppiVar13[lVar36 - iVar16] = ppiVar13[lVar36];
        }
      }
      ppiVar13 = ppiVar13 + -(long)iVar16;
      uVar9 = (ulong)uVar10;
    }
    iVar16 = (int)uVar4 % (int)(uVar11 * 2);
    iVar31 = uVar4 - iVar16;
    ppiVar25 = ppiVar13 + iVar31;
    lVar8 = (long)(int)uVar11;
    if (iVar16 - uVar11 == 0 || iVar16 < (int)uVar11) {
      memcpy(ppiVar25 + lVar8,ppiVar25,(long)iVar16 << 3);
    }
    else {
      stable_sqrt_sort_merge_right(ppiVar25,uVar11,iVar16 - uVar11,uVar11);
    }
    iVar16 = (Len - iVar16) + uVar11 * -3;
    for (; 0 < iVar31; iVar31 = iVar31 + uVar11 * -2) {
      stable_sqrt_sort_merge_right(ppiVar13 + iVar16,uVar11,uVar11,uVar11);
      iVar16 = iVar16 + uVar11 * -2;
    }
    iVar16 = -uVar11;
    uVar10 = uVar11;
    while (uVar15 = uVar10 * 2, (int)uVar15 < Len) {
      uVar32 = uVar10 * 4;
      uVar9 = (long)(int)uVar4 / (long)(int)uVar32 & 0xffffffff;
      uVar17 = (int)uVar4 % (int)uVar32;
      iVar31 = 0;
      uVar18 = uVar17;
      uVar2 = 0;
      if (uVar17 != uVar15 && SBORROW4(uVar17,uVar15) == (int)(uVar17 + uVar10 * -2) < 0) {
        uVar18 = 0;
        uVar2 = uVar17;
      }
      iVar5 = (int)((long)(int)uVar4 / (long)(int)uVar32);
      if (iVar5 < 0) {
        iVar5 = -1;
      }
      for (uVar23 = 0; (uVar23 != (long)iVar5 + 1U && ((uVar2 != 0 || (uVar23 != uVar9))));
          uVar23 = uVar23 + 1) {
        lVar36 = (long)iVar31;
        local_d8 = arr + lVar8 + uVar37 + lVar36 + -1;
        local_f8 = arr + (long)iVar16 + lVar8 + uVar37 + lVar36;
        ppiVar13 = arr + uVar37 + lVar36;
        ppiVar25 = arr + lVar8 + uVar37 + lVar36;
        uVar10 = uVar32;
        if (uVar23 == uVar9) {
          uVar10 = uVar2;
        }
        iVar27 = (int)((long)(int)uVar10 / (long)(int)uVar11);
        for (lVar20 = 0; lVar20 <= (int)((uint)(uVar23 == uVar9) + iVar27); lVar20 = lVar20 + 1) {
          Tags[lVar20] = (int)lVar20;
        }
        arr_00 = ppiVar1 + (int)(uVar32 * (int)uVar23);
        for (uVar28 = 1; (long)uVar28 < (long)iVar27; uVar28 = uVar28 + 1) {
          uVar14 = uVar28 - 1 & 0xffffffff;
          uVar21 = uVar28;
          ppiVar35 = ppiVar25;
          while( true ) {
            iVar26 = (int)uVar14;
            if ((long)iVar27 <= (long)uVar21) break;
            if ((**ppiVar35 < *arr_00[(int)(iVar26 * uVar11)]) ||
               ((*arr_00[(int)(iVar26 * uVar11)] == **ppiVar35 && (Tags[uVar21] < Tags[iVar26])))) {
              uVar14 = uVar21 & 0xffffffff;
            }
            uVar21 = uVar21 + 1;
            ppiVar35 = ppiVar35 + lVar8;
          }
          if (uVar28 - 1 != uVar14) {
            for (lVar20 = 0; uVar11 != (uint)lVar20; lVar20 = lVar20 + 1) {
              piVar29 = ppiVar13[lVar20];
              ppiVar13[lVar20] = arr[uVar37 + lVar36 + (int)(iVar26 * uVar11) + lVar20];
              arr[uVar37 + lVar36 + (int)(iVar26 * uVar11) + lVar20] = piVar29;
            }
            iVar33 = Tags[uVar28 - 1];
            Tags[uVar28 - 1] = Tags[iVar26];
            Tags[iVar26] = iVar33;
          }
          ppiVar25 = ppiVar25 + lVar8;
          ppiVar13 = ppiVar13 + lVar8;
        }
        iVar26 = 0;
        bVar38 = true;
        if (uVar23 == uVar9) {
          iVar33 = 0;
          if ((int)uVar2 % (int)uVar11 != 0) {
            uVar28 = 0;
            if (0 < iVar27) {
              uVar28 = (long)(int)uVar10 / (long)(int)uVar11 & 0xffffffff;
            }
            iVar26 = (iVar27 + -1) * uVar11;
            uVar10 = 0xffffffff;
            uVar21 = uVar28;
            do {
              bVar38 = uVar21 == 0;
              uVar21 = uVar21 - 1;
              if (bVar38) goto LAB_0010a227;
              lVar36 = (long)iVar26;
              uVar10 = uVar10 + 1;
              iVar26 = iVar26 - uVar11;
            } while (*arr_00[(int)(iVar27 * uVar11)] < *arr_00[lVar36]);
            uVar28 = (ulong)uVar10;
LAB_0010a227:
            iVar33 = (int)uVar28;
            bVar38 = false;
            iVar26 = (int)uVar2 % (int)uVar11;
          }
        }
        else {
          iVar33 = 0;
        }
        if (iVar27 - iVar33 == 0) {
          iVar27 = iVar27 * uVar11;
LAB_0010a441:
          stable_sqrt_sort_merge_left_with_x_buf(arr_00,iVar27,iVar26,iVar16);
        }
        else {
          uVar19 = (uint)((int)uVar15 / (int)uVar11 <= *Tags);
          lVar36 = 1;
          uVar10 = uVar11;
          uVar17 = uVar11;
          while( true ) {
            uVar30 = uVar17 - uVar10;
            lVar20 = (long)(int)uVar10;
            if (iVar27 - iVar33 <= lVar36) break;
            ppiVar13 = arr_00 + (int)uVar30;
            if (uVar19 == (int)uVar15 / (int)uVar11 <= Tags[lVar36]) {
              memcpy(ppiVar13 + -lVar8,ppiVar13,(long)(int)uVar10 << 3);
              uVar10 = uVar11;
            }
            else {
              iVar12 = uVar10 + uVar11;
              ppiVar25 = local_f8 + -lVar20;
              uVar28 = 0;
              for (uVar30 = uVar10;
                  (iVar34 = (int)uVar28, iVar34 < (int)uVar10 && ((int)uVar30 < iVar12));
                  uVar30 = uVar30 + (-1 < iVar24)) {
                iVar24 = (*ppiVar13[uVar28] + (uVar19 - 1)) - *ppiVar13[(int)uVar30];
                piVar29 = ppiVar13[uVar28];
                if (-1 < iVar24) {
                  piVar29 = ppiVar13[(int)uVar30];
                }
                uVar28 = (ulong)(uint)(iVar34 - (iVar24 >> 0x1f));
                *ppiVar25 = piVar29;
                ppiVar25 = ppiVar25 + 1;
              }
              uVar6 = uVar10 - iVar34;
              if (uVar6 == 0 || (int)uVar10 < iVar34) {
                uVar19 = 1 - uVar19;
                uVar10 = iVar12 - uVar30;
              }
              else {
                ppiVar13 = local_d8;
                for (lVar22 = lVar20; uVar10 = uVar6, (long)uVar28 < lVar22; lVar22 = lVar22 + -1) {
                  ppiVar13[iVar12 - lVar20] = *ppiVar13;
                  ppiVar13 = ppiVar13 + -1;
                }
              }
            }
            lVar36 = lVar36 + 1;
            uVar17 = uVar17 + uVar11;
            local_f8 = local_f8 + lVar8;
            local_d8 = local_d8 + lVar8;
          }
          if (!bVar38) {
            if (uVar19 == 0) {
              iVar27 = uVar10 + iVar33 * uVar11;
            }
            else {
              memcpy(arr_00 + (int)uVar30 + -lVar8,arr_00 + (int)uVar30,lVar20 << 3);
              iVar27 = iVar33 * uVar11;
              uVar30 = uVar17;
            }
            arr_00 = arr_00 + (int)uVar30;
            goto LAB_0010a441;
          }
          memcpy(arr_00 + (int)uVar30 + -lVar8,arr_00 + (int)uVar30,lVar20 << 3);
        }
        iVar31 = iVar31 + uVar32;
      }
      lVar36 = (long)(int)(uVar4 - uVar18);
      ppiVar13 = arr + uVar37 + lVar36;
      for (; ppiVar13 = ppiVar13 + -1, uVar10 = uVar15, 0 < lVar36; lVar36 = lVar36 + -1) {
        *ppiVar13 = arr[(uVar37 + lVar36 + -1) - lVar8];
      }
    }
    ppiVar13 = arr + (long)iVar16 + uVar37;
    uVar15 = 0;
    iVar16 = 0;
    uVar10 = uVar11;
    while (iVar16 < (int)uVar11) {
      if (uVar15 == uVar4) {
        piVar3 = extbuf[iVar16];
LAB_0010a50b:
        piVar29 = piVar3;
        iVar16 = iVar16 + 1;
      }
      else {
        piVar29 = ppiVar1[(int)uVar15];
        piVar3 = extbuf[iVar16];
        if (*extbuf[iVar16] <= *piVar29) goto LAB_0010a50b;
        uVar15 = uVar15 + 1;
      }
      *ppiVar13 = piVar29;
      ppiVar13 = ppiVar13 + 1;
      uVar10 = uVar10 - 1;
    }
    if (uVar10 + uVar15 != 0) {
      for (lVar8 = (long)(int)uVar15; lVar8 < lVar7; lVar8 = lVar8 + 1) {
        *ppiVar13 = ppiVar1[lVar8];
        ppiVar13 = ppiVar13 + 1;
      }
    }
  }
  return;
}

Assistant:

static void SQRT_SORT_COMMON_SORT(SORT_TYPE *arr, int Len, SORT_TYPE *extbuf,
                                  int *Tags) {
  int lblock, cbuf;

  if (Len < 16) {
    SQRT_SORT_SORT_INS(arr, Len);
    return;
  }

  lblock = 1;

  while (lblock * lblock < Len) {
    lblock *= 2;
  }

  SORT_TYPE_CPY(extbuf, arr, lblock);
  SQRT_SORT_COMMON_SORT(extbuf, lblock, arr, Tags);
  SQRT_SORT_BUILD_BLOCKS(arr + lblock, Len - lblock, lblock);
  cbuf = lblock;

  while (Len > (cbuf *= 2)) {
    SQRT_SORT_COMBINE_BLOCKS(arr + lblock, Len - lblock, cbuf, lblock, Tags);
  }

  SQRT_SORT_MERGE_DOWN(arr + lblock, extbuf, Len - lblock, lblock);
}